

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O3

CURLcode imap_do(Curl_easy *data,_Bool *done)

{
  curl_mimepart *part;
  uint *puVar1;
  IMAP *pIVar2;
  connectdata *conn;
  FILEPROTO *pFVar3;
  connectdata *pcVar4;
  bool bVar5;
  _Bool _Var6;
  char cVar7;
  CURLcode CVar8;
  int iVar9;
  imapstate iVar10;
  curl_off_t cVar11;
  CURLcode CVar12;
  long lVar13;
  size_t sVar14;
  char *pcVar15;
  char *pcVar16;
  char *pcVar17;
  char *value;
  char *name;
  char *local_50;
  Curl_easy *local_48;
  char *local_40;
  size_t local_38;
  
  *done = false;
  pIVar2 = (data->req).p.imap;
  pcVar16 = (data->state).up.path;
  lVar13 = 1;
  pcVar15 = pcVar16;
  do {
    pcVar17 = pcVar15;
    pcVar15 = pcVar17 + 1;
    _Var6 = imap_is_bchar(pcVar17[1]);
    lVar13 = lVar13 + -1;
  } while (_Var6);
  if (lVar13 == 0) {
    pIVar2->mailbox = (char *)0x0;
  }
  else {
    pcVar16 = pcVar16 + 1;
    if (*pcVar17 != '/') {
      pcVar17 = pcVar15;
    }
    CVar8 = Curl_urldecode(pcVar16,(long)pcVar17 - (long)pcVar16,&pIVar2->mailbox,(size_t *)0x0,
                           REJECT_CTRL);
    if (CVar8 != CURLE_OK) {
      return CVar8;
    }
  }
  cVar7 = *pcVar15;
  while (cVar7 == ';') {
    pcVar16 = pcVar15 + 1;
    pcVar17 = pcVar15 + 2;
    sVar14 = 0;
    pcVar15 = pcVar16;
    while( true ) {
      if (pcVar17[-1] == '\0') {
        return CURLE_URL_MALFORMAT;
      }
      if (pcVar17[-1] == '=') break;
      pcVar17 = pcVar17 + 1;
      sVar14 = sVar14 + 1;
      pcVar15 = pcVar15 + 1;
    }
    local_48 = data;
    CVar8 = Curl_urldecode(pcVar16,sVar14,&local_40,(size_t *)0x0,REJECT_CTRL);
    if (CVar8 != CURLE_OK) {
      return CVar8;
    }
    sVar14 = 0xffffffffffffffff;
    do {
      pcVar16 = pcVar15 + 1;
      pcVar15 = pcVar15 + 1;
      _Var6 = imap_is_bchar(*pcVar16);
      sVar14 = sVar14 + 1;
    } while (_Var6);
    CVar8 = Curl_urldecode(pcVar17,sVar14,&local_50,&local_38,REJECT_CTRL);
    if (CVar8 != CURLE_OK) {
      (*Curl_cfree)(local_40);
      return CVar8;
    }
    iVar9 = curl_strequal(local_40,"UIDVALIDITY");
    if ((iVar9 == 0) || (pIVar2->uidvalidity != (char *)0x0)) {
      iVar9 = curl_strequal(local_40,"UID");
      if ((iVar9 == 0) || (pIVar2->uid != (char *)0x0)) {
        iVar9 = curl_strequal(local_40,"MAILINDEX");
        if ((iVar9 == 0) || (pIVar2->mindex != (char *)0x0)) {
          iVar9 = curl_strequal(local_40,"SECTION");
          data = local_48;
          if ((iVar9 == 0) || (pIVar2->section != (char *)0x0)) {
            iVar9 = curl_strequal(local_40,"PARTIAL");
            if ((iVar9 == 0) || (pIVar2->partial != (char *)0x0)) {
              (*Curl_cfree)(local_40);
              (*Curl_cfree)(local_50);
              return CURLE_URL_MALFORMAT;
            }
            if ((local_38 != 0) && (local_50[local_38 - 1] == '/')) {
              local_50[local_38 - 1] = '\0';
            }
            pIVar2->partial = local_50;
          }
          else {
            if ((local_38 != 0) && (local_50[local_38 - 1] == '/')) {
              local_50[local_38 - 1] = '\0';
            }
            pIVar2->section = local_50;
          }
        }
        else {
          if ((local_38 != 0) && (local_50[local_38 - 1] == '/')) {
            local_50[local_38 - 1] = '\0';
          }
          pIVar2->mindex = local_50;
          data = local_48;
        }
      }
      else {
        if ((local_38 != 0) && (local_50[local_38 - 1] == '/')) {
          local_50[local_38 - 1] = '\0';
        }
        pIVar2->uid = local_50;
        data = local_48;
      }
    }
    else {
      if ((local_38 != 0) && (local_50[local_38 - 1] == '/')) {
        local_50[local_38 - 1] = '\0';
      }
      pIVar2->uidvalidity = local_50;
      data = local_48;
    }
    local_50 = (char *)0x0;
    (*Curl_cfree)(local_40);
    (*Curl_cfree)(local_50);
    cVar7 = *pcVar15;
  }
  if (((pIVar2->mailbox != (char *)0x0) && (pIVar2->uid == (char *)0x0)) &&
     (pIVar2->mindex == (char *)0x0)) {
    curl_url_get((data->state).uh,CURLUPART_QUERY,&pIVar2->query,0x40);
    cVar7 = *pcVar15;
  }
  if (cVar7 != '\0') {
    return CURLE_URL_MALFORMAT;
  }
  pcVar16 = (data->set).str[0x1c];
  if (pcVar16 != (char *)0x0) {
    pIVar2 = (data->req).p.imap;
    CVar8 = Curl_urldecode(pcVar16,0,&pIVar2->custom,(size_t *)0x0,REJECT_CTRL);
    if (CVar8 != CURLE_OK) {
      return CVar8;
    }
    pcVar16 = pIVar2->custom;
    pcVar15 = pcVar16;
    for (; *pcVar16 != '\0'; pcVar16 = pcVar16 + 1) {
      if (*pcVar16 == ' ') {
        pcVar16 = (*Curl_cstrdup)(pcVar16);
        pIVar2->custom_params = pcVar16;
        *pcVar15 = '\0';
        if (pIVar2->custom_params == (char *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
        break;
      }
      pcVar15 = pcVar15 + 1;
    }
  }
  (data->req).size = -1;
  Curl_pgrsSetUploadCounter(data,0);
  Curl_pgrsSetDownloadCounter(data,0);
  Curl_pgrsSetUploadSize(data,-1);
  Curl_pgrsSetDownloadSize(data,-1);
  conn = data->conn;
  pIVar2 = (data->req).p.imap;
  if (((data->req).field_0xdb & 2) != 0) {
    pIVar2->transfer = PPTRANSFER_INFO;
  }
  *done = false;
  if ((((pIVar2->mailbox == (char *)0x0) ||
       (pcVar16 = (conn->proto).imapc.mailbox, pcVar16 == (char *)0x0)) ||
      (iVar9 = curl_strequal(pIVar2->mailbox,pcVar16), iVar9 == 0)) ||
     (((pIVar2->uidvalidity != (char *)0x0 &&
       (pcVar16 = (conn->proto).ftpc.server_os, pcVar16 != (char *)0x0)) &&
      (iVar9 = curl_strequal(pIVar2->uidvalidity,pcVar16), iVar9 == 0)))) {
    bVar5 = false;
  }
  else {
    bVar5 = true;
  }
  if ((((data->state).field_0x776 & 2) != 0) || ((data->set).mimepost.kind != MIMEKIND_NONE)) {
    pFVar3 = (data->req).p.file;
    if (pFVar3->freepath == (char *)0x0) {
      pcVar16 = "Cannot APPEND without a mailbox.";
      goto LAB_0013af75;
    }
    if ((data->set).mimepost.kind == MIMEKIND_NONE) {
      CVar8 = Curl_creader_set_fread(data,(data->state).infilesize);
      if (CVar8 != CURLE_OK) {
        return CVar8;
      }
      cVar11 = (data->state).infilesize;
    }
    else {
      part = &(data->set).mimepost;
      puVar1 = &(data->set).mimepost.flags;
      *(byte *)puVar1 = (byte)*puVar1 & 0xfd;
      curl_mime_headers(part,(data->set).headers,0);
      CVar8 = Curl_mime_prepare_headers(data,part,(char *)0x0,(char *)0x0,MIMESTRATEGY_MAIL);
      if (CVar8 != CURLE_OK) {
        return CVar8;
      }
      pcVar16 = Curl_checkheaders(data,"Mime-Version",0xc);
      if ((pcVar16 == (char *)0x0) &&
         (CVar8 = Curl_mime_add_header(&(data->set).mimepost.curlheaders,"Mime-Version: 1.0"),
         CVar8 != CURLE_OK)) {
        return CVar8;
      }
      CVar8 = Curl_creader_set_mime(data,part);
      if (CVar8 != CURLE_OK) {
        return CVar8;
      }
      cVar11 = Curl_creader_client_length(data);
      (data->state).infilesize = cVar11;
    }
    if (cVar11 < 0) {
      Curl_failf(data,"Cannot APPEND with unknown input file size");
      return CURLE_UPLOAD_FAILED;
    }
    pcVar16 = imap_atom(pFVar3->freepath,false);
    if (pcVar16 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    CVar8 = imap_sendf(data,"APPEND %s (\\Seen) {%ld}",pcVar16,(data->state).infilesize);
    (*Curl_cfree)(pcVar16);
    if (CVar8 != CURLE_OK) {
      return CVar8;
    }
    iVar10 = IMAP_APPEND;
LAB_0013b162:
    (data->conn->proto).imapc.state = iVar10;
    goto LAB_0013b1a8;
  }
  if (pIVar2->custom == (char *)0x0) {
    if (!bVar5) {
      if (pIVar2->mailbox != (char *)0x0) {
        if ((pIVar2->uid == (char *)0x0) && (pIVar2->mindex == (char *)0x0)) {
          pcVar16 = pIVar2->query;
          goto joined_r0x0013b0cd;
        }
        goto LAB_0013b0d3;
      }
      goto LAB_0013b196;
    }
    if ((pIVar2->uid == (char *)0x0) && (pIVar2->mindex == (char *)0x0)) {
      if (pIVar2->query == (char *)0x0) goto LAB_0013b196;
      CVar8 = imap_perform_search(data);
    }
    else {
      CVar8 = imap_perform_fetch(data);
    }
  }
  else {
    if (!bVar5) {
      pcVar16 = pIVar2->mailbox;
joined_r0x0013b0cd:
      if (pcVar16 != (char *)0x0) {
LAB_0013b0d3:
        pcVar4 = data->conn;
        local_48 = (Curl_easy *)(data->req).p.file;
        (*Curl_cfree)((pcVar4->proto).imapc.mailbox);
        (pcVar4->proto).ftpc.retr_size_saved = 0;
        (*Curl_cfree)((pcVar4->proto).ftpc.server_os);
        (pcVar4->proto).ftpc.server_os = (char *)0x0;
        if ((char *)local_48->id == (char *)0x0) {
          pcVar16 = "Cannot SELECT without a mailbox.";
LAB_0013af75:
          Curl_failf(data,pcVar16);
          return CURLE_URL_MALFORMAT;
        }
        pcVar16 = imap_atom((char *)local_48->id,false);
        if (pcVar16 == (char *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
        CVar8 = imap_sendf(data,"SELECT %s",pcVar16);
        (*Curl_cfree)(pcVar16);
        if (CVar8 != CURLE_OK) {
          return CVar8;
        }
        iVar10 = IMAP_SELECT;
        goto LAB_0013b162;
      }
    }
LAB_0013b196:
    CVar8 = imap_perform_list(data);
  }
  if (CVar8 != CURLE_OK) {
    return CVar8;
  }
LAB_0013b1a8:
  CVar8 = imap_multi_statemach(data,done);
  CVar12 = CURLE_OK;
  Curl_conn_is_connected(conn,0);
  if (((CVar8 == CURLE_OK) && (CVar8 = CVar12, *done == true)) &&
     (((data->req).p.imap)->transfer != PPTRANSFER_BODY)) {
    Curl_xfer_setup_nop(data);
  }
  return CVar8;
}

Assistant:

static CURLcode imap_do(struct Curl_easy *data, bool *done)
{
  CURLcode result = CURLE_OK;
  *done = FALSE; /* default to false */

  /* Parse the URL path */
  result = imap_parse_url_path(data);
  if(result)
    return result;

  /* Parse the custom request */
  result = imap_parse_custom_request(data);
  if(result)
    return result;

  result = imap_regular_transfer(data, done);

  return result;
}